

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O2

VRMatrix4 * MinVR::VRMatrix4::scale(VRMatrix4 *__return_storage_ptr__,VRVector3 *v)

{
  float local_48 [6];
  undefined8 local_30;
  undefined8 uStack_28;
  float local_20;
  undefined8 local_1c;
  undefined8 uStack_14;
  undefined4 local_c;
  
  local_48[0] = v->x;
  local_48[5] = v->y;
  local_20 = v->z;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  local_48[4] = 0.0;
  local_30 = 0;
  uStack_28 = 0;
  local_1c = 0;
  uStack_14 = 0;
  local_c = 0x3f800000;
  VRMatrix4(__return_storage_ptr__,local_48);
  return __return_storage_ptr__;
}

Assistant:

VRMatrix4 VRMatrix4::scale(const VRVector3& v) {
    return VRMatrix4::fromRowMajorElements(v[0], 0, 0, 0,
                                           0, v[1], 0, 0,
                                           0, 0, v[2], 0,
                                           0, 0, 0, 1);
}